

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::setNormalMode(QMdiSubWindowPrivate *this)

{
  QSize QVar1;
  QSize QVar2;
  int minw;
  int minh;
  QWidget *this_00;
  Data *pDVar3;
  short sVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this->isShadeMode = false;
  this->isMaximizeMode = false;
  ensureWindowState(this,WindowNoState);
  removeButtonsFromMenuBar(this);
  sVar4 = (short)this_00->data->widget_attributes;
  if (sVar4 < 0) {
    (**(code **)(*(long *)this_00 + 0x68))(this_00,0);
  }
  minw = (this->userMinimumSize).wd.m_i;
  minh = (this->userMinimumSize).ht.m_i;
  if (minw != 0 || minh != 0) {
    QWidget::setMinimumSize(this_00,minw,minh);
    (this->userMinimumSize).wd = 0;
    (this->userMinimumSize).ht = 0;
  }
  pDVar3 = (this->baseWidget).wp.d;
  if ((((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
      ((this->baseWidget).wp.value != (QObject *)0x0)) && (this->isWidgetHiddenByUs == true)) {
    QWidget::show((QWidget *)(this->baseWidget).wp.value);
    this->isWidgetHiddenByUs = false;
  }
  updateGeometryConstraints(this);
  local_38.x1.m_i = (this->oldGeometry).x1.m_i;
  local_38.y1.m_i = (this->oldGeometry).y1.m_i;
  QVar1 = this->restoreSize;
  QVar2 = this->internalMinimumSize;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = QVar2.wd.m_i;
  auVar6._4_4_ = QVar2.ht.m_i;
  auVar7._0_8_ = CONCAT44(-(uint)(QVar2.ht.m_i.m_i < QVar1.ht.m_i.m_i),
                          -(uint)(QVar2.wd.m_i.m_i < QVar1.wd.m_i.m_i));
  auVar7._8_8_ = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (ulong)QVar1 & auVar7._0_8_;
  auVar5 = ~auVar7 & auVar6 | auVar5;
  local_38.x2.m_i = local_38.x1.m_i + -1 + auVar5._0_4_;
  local_38.y2.m_i = local_38.y1.m_i + -1 + auVar5._4_4_;
  QWidget::setGeometry(this_00,&local_38);
  if (sVar4 < 0) {
    (**(code **)(*(long *)this_00 + 0x68))(this_00,1);
  }
  (this->restoreSize).wd = -1;
  (this->restoreSize).ht = -1;
  setSizeGripVisible(this,true);
  setEnabled(this,MoveAction,true);
  setEnabled(this,MaximizeAction,true);
  setEnabled(this,MinimizeAction,true);
  setEnabled(this,RestoreAction,false);
  setEnabled(this,ResizeAction,this->resizeEnabled);
  setActive(this,true,true);
  restoreFocus(this);
  updateMask(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setNormalMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    isShadeMode = false;
    isMaximizeMode = false;

    ensureWindowState(Qt::WindowNoState);
#if QT_CONFIG(menubar)
    removeButtonsFromMenuBar();
#endif

    // Hide the window before we change the geometry to avoid multiple resize
    // events and wrong window state.
    const bool wasVisible = q->isVisible();
    if (wasVisible)
        q->setVisible(false);

    // Restore minimum size if set by user.
    if (!userMinimumSize.isNull()) {
        q->setMinimumSize(userMinimumSize);
        userMinimumSize = QSize(0, 0);
    }

    // Show the internal widget if it was hidden by us,
    if (baseWidget && isWidgetHiddenByUs) {
        baseWidget->show();
        isWidgetHiddenByUs = false;
    }

    updateGeometryConstraints();
    QRect newGeometry = oldGeometry;
    newGeometry.setSize(restoreSize.expandedTo(internalMinimumSize));
    q->setGeometry(newGeometry);

    if (wasVisible)
        q->setVisible(true);

    // Invalidate the restore size.
    restoreSize.setWidth(-1);
    restoreSize.setHeight(-1);

#if QT_CONFIG(sizegrip)
    setSizeGripVisible(true);
#endif

#ifndef QT_NO_ACTION
    setEnabled(MoveAction, true);
    setEnabled(MaximizeAction, true);
    setEnabled(MinimizeAction, true);
    setEnabled(RestoreAction, false);
    setEnabled(ResizeAction, resizeEnabled);
#endif // QT_NO_ACTION

    Q_ASSERT(!(q_func()->windowState() & Qt::WindowMinimized));
    // This sub-window can be maximized when shown above if not the
    // QMdiArea::DontMaximizeSubWindowOnActionvation is set. Make sure
    // the Qt::WindowMaximized flag is set accordingly.
    Q_ASSERT((isMaximizeMode && q_func()->windowState() & Qt::WindowMaximized)
             || (!isMaximizeMode && !(q_func()->windowState() & Qt::WindowMaximized)));
    Q_ASSERT(!isShadeMode);

    setActive(true);
    restoreFocus();
    updateMask();
}